

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O2

void OPN2_DoRegWrite(ym3438_t *chip)

{
  ushort uVar1;
  ulong uVar2;
  Bit8u BVar3;
  uint uVar4;
  long lVar5;
  byte bVar6;
  ulong uVar7;
  byte bVar8;
  Bit8u BVar9;
  bool bVar10;
  
  uVar2 = (ulong)chip->cycles % 0xc;
  BVar3 = chip->write_fm_data;
  if (BVar3 != '\0') {
    uVar4 = chip->channel;
    uVar1 = chip->address;
    if (op_offset[uVar2] == (uVar1 & 0x107)) {
      uVar7 = (ulong)((int)uVar2 + 0xc);
      if ((uVar1 & 8) == 0) {
        uVar7 = uVar2;
      }
      switch((uVar1 & 0xf0) - 0x30 >> 4) {
      case 0:
        bVar6 = chip->data;
        bVar8 = bVar6 & 0xf;
        BVar9 = '\x01';
        if (bVar8 != 0) {
          BVar9 = bVar8 * '\x02';
        }
        chip->multi[uVar7] = BVar9;
        chip->dt[uVar7] = bVar6 >> 4 & 7;
        break;
      case 1:
        chip->tl[uVar7] = chip->data & 0x7f;
        break;
      case 2:
        bVar6 = chip->data;
        chip->ar[uVar7] = bVar6 & 0x1f;
        chip->ks[uVar7] = bVar6 >> 6;
        break;
      case 3:
        bVar6 = chip->data;
        chip->dr[uVar7] = bVar6 & 0x1f;
        chip->am[uVar7] = bVar6 >> 7;
        break;
      case 4:
        chip->sr[uVar7] = chip->data & 0x1f;
        break;
      case 5:
        bVar6 = chip->data;
        chip->rr[uVar7] = bVar6 & 0xf;
        bVar6 = bVar6 >> 4;
        chip->sl[uVar7] = bVar6 + 1 & 0x10 | bVar6;
        break;
      case 6:
        chip->ssg_eg[uVar7] = chip->data & 0xf;
      }
    }
    if (ch_offset[uVar4] == (uVar1 & 0x103)) {
      switch((uVar1 & 0xfc) - 0xa0 >> 2) {
      case 0:
        bVar6 = chip->reg_a4;
        chip->fnum[uVar4] = (bVar6 & 7) << 8 | (ushort)chip->data;
        bVar6 = bVar6 >> 3 & 7;
        chip->block[uVar4] = bVar6;
        chip->kcode[uVar4] = bVar6 << 2 | (byte)fn_note[chip->fnum[uVar4] >> 7];
        break;
      case 1:
        chip->reg_a4 = chip->data;
        break;
      case 2:
        bVar6 = chip->reg_ac;
        chip->fnum_3ch[uVar4] = (bVar6 & 7) << 8 | (ushort)chip->data;
        bVar6 = bVar6 >> 3 & 7;
        chip->block_3ch[uVar4] = bVar6;
        chip->kcode_3ch[uVar4] = bVar6 << 2 | (byte)fn_note[chip->fnum_3ch[uVar4] >> 7];
        break;
      case 3:
        chip->reg_ac = chip->data;
        break;
      case 4:
        bVar6 = chip->data;
        chip->connect[uVar4] = bVar6 & 7;
        chip->fb[uVar4] = bVar6 >> 3 & 7;
        break;
      case 5:
        bVar6 = chip->data;
        chip->pms[uVar4] = bVar6 & 7;
        chip->ams[uVar4] = bVar6 >> 4 & 3;
        chip->pan_l[uVar4] = bVar6 >> 7;
        chip->pan_r[uVar4] = bVar6 >> 6 & 1;
      }
    }
  }
  BVar9 = chip->write_a_en;
  if (BVar9 == '\0') {
    if (chip->write_d_en == '\0') goto LAB_001660e6;
  }
  else {
    chip->write_fm_data = '\0';
    BVar3 = '\0';
  }
  if ((chip->write_fm_address != '\0') && (chip->write_d_en != '\0')) {
    chip->write_fm_data = '\x01';
    BVar3 = '\x01';
  }
  if (BVar9 != '\0') {
    bVar10 = (chip->write_data & 0xf0) != 0;
    if (bVar10) {
      chip->address = chip->write_data;
    }
    chip->write_fm_address = bVar10;
  }
  if (((chip->write_d_en != '\0') && (uVar1 = chip->write_data, (uVar1 >> 8 & 1) == 0)) &&
     (chip->write_fm_mode_a - 0x21 < 0xc)) {
    bVar6 = (byte)uVar1;
    switch((uint)chip->write_fm_mode_a) {
    case 0x21:
      for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
        chip->mode_test_21[lVar5] = (uVar1 >> ((uint)lVar5 & 0x1f) & 1) != 0;
      }
      break;
    case 0x22:
      bVar8 = 0x7f;
      if ((uVar1 & 8) == 0) {
        bVar8 = bVar6 & 8;
      }
      chip->lfo_en = bVar8;
      chip->lfo_freq = bVar6 & 7;
      break;
    case 0x24:
      chip->timer_a_reg = (chip->timer_a_reg & 3) + (uVar1 & 0xff) * 4;
      break;
    case 0x25:
      chip->timer_a_reg = uVar1 & 3 | chip->timer_a_reg & 0x3fc;
      break;
    case 0x26:
      chip->timer_b_reg = uVar1 & 0xff;
      break;
    case 0x27:
      chip->mode_ch3 = bVar6 >> 6;
      chip->mode_csm = bVar6 >> 6 == 2;
      chip->timer_a_load = bVar6 & 1;
      chip->timer_a_enable = bVar6 >> 2 & 1;
      chip->timer_a_reset = bVar6 >> 4 & 1;
      chip->timer_b_load = bVar6 >> 1 & 1;
      chip->timer_b_enable = bVar6 >> 3 & 1;
      chip->timer_b_reset = bVar6 >> 5 & 1;
      break;
    case 0x28:
      for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
        chip->mode_kon_operator[lVar5] = (uVar1 >> ((byte)((byte)lVar5 | 4) & 0x1f) & 1) != 0;
      }
      uVar4 = uVar1 & 3;
      if (uVar4 == 3) {
        chip->mode_kon_channel = 0xff;
      }
      else {
        chip->mode_kon_channel = ((byte)((int)((uint)uVar1 << 0x1d) >> 0x1f) & 3) + (char)uVar4;
      }
      break;
    case 0x2a:
      chip->dacdata = (chip->dacdata & 1U) + uVar1 * 2 ^ 0x100;
      break;
    case 0x2b:
      chip->dacen = (Bit8u)(uVar1 >> 7);
      break;
    case 0x2c:
      for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
        chip->mode_test_2c[lVar5] = (uVar1 >> ((uint)lVar5 & 0x1f) & 1) != 0;
      }
      chip->dacdata = (ushort)chip->mode_test_2c[3] | chip->dacdata & 0x1feU;
      if (chip->mode_test_2c[7] == '\0') {
        bVar10 = chip->mode_test_2c[6] != '\0';
      }
      else {
        bVar10 = false;
      }
      chip->eg_custom_timer = bVar10;
    }
  }
  if (BVar9 != '\0') {
    chip->write_fm_mode_a = chip->write_data & 0x1ff;
  }
LAB_001660e6:
  if (BVar3 != '\0') {
    chip->data = (Bit8u)chip->write_data;
  }
  return;
}

Assistant:

void OPN2_DoRegWrite(ym3438_t *chip)
{
    Bit32u i;
    Bit32u slot = chip->cycles % 12;
    Bit32u address;
    Bit32u channel = chip->channel;
    /* Update registers */
    if (chip->write_fm_data)
    {
        /* Slot */
        if (op_offset[slot] == (chip->address & 0x107))
        {
            if (chip->address & 0x08)
            {
                /* OP2, OP4 */
                slot += 12;
            }
            address = chip->address & 0xf0;
            switch (address)
            {
            case 0x30: /* DT, MULTI */
                chip->multi[slot] = chip->data & 0x0f;
                if (!chip->multi[slot])
                {
                    chip->multi[slot] = 1;
                }
                else
                {
                    chip->multi[slot] <<= 1;
                }
                chip->dt[slot] = (chip->data >> 4) & 0x07;
                break;
            case 0x40: /* TL */
                chip->tl[slot] = chip->data & 0x7f;
                break;
            case 0x50: /* KS, AR */
                chip->ar[slot] = chip->data & 0x1f;
                chip->ks[slot] = (chip->data >> 6) & 0x03;
                break;
            case 0x60: /* AM, DR */
                chip->dr[slot] = chip->data & 0x1f;
                chip->am[slot] = (chip->data >> 7) & 0x01;
                break;
            case 0x70: /* SR */
                chip->sr[slot] = chip->data & 0x1f;
                break;
            case 0x80: /* SL, RR */
                chip->rr[slot] = chip->data & 0x0f;
                chip->sl[slot] = (chip->data >> 4) & 0x0f;
                chip->sl[slot] |= (chip->sl[slot] + 1) & 0x10;
                break;
            case 0x90: /* SSG-EG */
                chip->ssg_eg[slot] = chip->data & 0x0f;
                break;
            default:
                break;
            }
        }

        /* Channel */
        if (ch_offset[channel] == (chip->address & 0x103))
        {
            address = chip->address & 0xfc;
            switch (address)
            {
            case 0xa0:
                chip->fnum[channel] = (chip->data & 0xff) | ((chip->reg_a4 & 0x07) << 8);
                chip->block[channel] = (chip->reg_a4 >> 3) & 0x07;
                chip->kcode[channel] = (chip->block[channel] << 2) | fn_note[chip->fnum[channel] >> 7];
                break;
            case 0xa4:
                chip->reg_a4 = chip->data & 0xff;
                break;
            case 0xa8:
                chip->fnum_3ch[channel] = (chip->data & 0xff) | ((chip->reg_ac & 0x07) << 8);
                chip->block_3ch[channel] = (chip->reg_ac >> 3) & 0x07;
                chip->kcode_3ch[channel] = (chip->block_3ch[channel] << 2) | fn_note[chip->fnum_3ch[channel] >> 7];
                break;
            case 0xac:
                chip->reg_ac = chip->data & 0xff;
                break;
            case 0xb0:
                chip->connect[channel] = chip->data & 0x07;
                chip->fb[channel] = (chip->data >> 3) & 0x07;
                break;
            case 0xb4:
                chip->pms[channel] = chip->data & 0x07;
                chip->ams[channel] = (chip->data >> 4) & 0x03;
                chip->pan_l[channel] = (chip->data >> 7) & 0x01;
                chip->pan_r[channel] = (chip->data >> 6) & 0x01;
                break;
            default:
                break;
            }
        }
    }

    if (chip->write_a_en || chip->write_d_en)
    {
        /* Data */
        if (chip->write_a_en)
        {
            chip->write_fm_data = 0;
        }

        if (chip->write_fm_address && chip->write_d_en)
        {
            chip->write_fm_data = 1;
        }

        /* Address */
        if (chip->write_a_en)
        {
            if ((chip->write_data & 0xf0) != 0x00)
            {
                /* FM Write */
                chip->address = chip->write_data;
                chip->write_fm_address = 1;
            }
            else
            {
                /* SSG write */
                chip->write_fm_address = 0;
            }
        }

        /* FM Mode */
        /* Data */
        if (chip->write_d_en && (chip->write_data & 0x100) == 0)
        {
            switch (chip->write_fm_mode_a)
            {
            case 0x21: /* LSI test 1 */
                for (i = 0; i < 8; i++)
                {
                    chip->mode_test_21[i] = (chip->write_data >> i) & 0x01;
                }
                break;
            case 0x22: /* LFO control */
                if ((chip->write_data >> 3) & 0x01)
                {
                    chip->lfo_en = 0x7f;
                }
                else
                {
                    chip->lfo_en = 0;
                }
                chip->lfo_freq = chip->write_data & 0x07;
                break;
            case 0x24: /* Timer A */
                chip->timer_a_reg &= 0x03;
                chip->timer_a_reg |= (chip->write_data & 0xff) << 2;
                break;
            case 0x25:
                chip->timer_a_reg &= 0x3fc;
                chip->timer_a_reg |= chip->write_data & 0x03;
                break;
            case 0x26: /* Timer B */
                chip->timer_b_reg = chip->write_data & 0xff;
                break;
            case 0x27: /* CSM, Timer control */
                chip->mode_ch3 = (chip->write_data & 0xc0) >> 6;
                chip->mode_csm = chip->mode_ch3 == 2;
                chip->timer_a_load = chip->write_data & 0x01;
                chip->timer_a_enable = (chip->write_data >> 2) & 0x01;
                chip->timer_a_reset = (chip->write_data >> 4) & 0x01;
                chip->timer_b_load = (chip->write_data >> 1) & 0x01;
                chip->timer_b_enable = (chip->write_data >> 3) & 0x01;
                chip->timer_b_reset = (chip->write_data >> 5) & 0x01;
                break;
            case 0x28: /* Key on/off */
                for (i = 0; i < 4; i++)
                {
                    chip->mode_kon_operator[i] = (chip->write_data >> (4 + i)) & 0x01;
                }
                if ((chip->write_data & 0x03) == 0x03)
                {
                    /* Invalid address */
                    chip->mode_kon_channel = 0xff;
                }
                else
                {
                    chip->mode_kon_channel = (chip->write_data & 0x03) + ((chip->write_data >> 2) & 1) * 3;
                }
                break;
            case 0x2a: /* DAC data */
                chip->dacdata &= 0x01;
                chip->dacdata |= (chip->write_data ^ 0x80) << 1;
                break;
            case 0x2b: /* DAC enable */
                chip->dacen = chip->write_data >> 7;
                break;
            case 0x2c: /* LSI test 2 */
                for (i = 0; i < 8; i++)
                {
                    chip->mode_test_2c[i] = (chip->write_data >> i) & 0x01;
                }
                chip->dacdata &= 0x1fe;
                chip->dacdata |= chip->mode_test_2c[3];
                chip->eg_custom_timer = !chip->mode_test_2c[7] && chip->mode_test_2c[6];
                break;
            default:
                break;
            }
        }

        /* Address */
        if (chip->write_a_en)
        {
            chip->write_fm_mode_a = chip->write_data & 0x1ff;
        }
    }

    if (chip->write_fm_data)
    {
        chip->data = chip->write_data & 0xff;
    }
}